

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

char * tinyxml2::XMLUtil::ReadBOM(char *p,bool *bom)

{
  *bom = false;
  if (((*p == -0x11) && (p[1] == -0x45)) && (p[2] == -0x41)) {
    *bom = true;
    p = p + 3;
  }
  return p;
}

Assistant:

const char* XMLUtil::ReadBOM(const char* p, bool* bom)
{
    TIXMLASSERT(p);
    TIXMLASSERT(bom);
    *bom = false;
    const unsigned char* pu = reinterpret_cast<const unsigned char*>(p);
    // Check for BOM:
    if (*(pu + 0) == TIXML_UTF_LEAD_0 && *(pu + 1) == TIXML_UTF_LEAD_1 &&
        *(pu + 2) == TIXML_UTF_LEAD_2) {
        *bom = true;
        p += 3;
    }
    TIXMLASSERT(p);
    return p;
}